

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathReleaseObject(xmlXPathContextPtr ctxt,xmlXPathObjectPtr obj)

{
  undefined8 *puVar1;
  xmlNodeSetPtr pxVar2;
  xmlNodePtr ns;
  xmlNodePtr node;
  int i;
  xmlNodeSetPtr tmpset;
  xmlXPathContextCachePtr cache;
  xmlXPathObjectPtr obj_local;
  xmlXPathContextPtr ctxt_local;
  
  if (obj == (xmlXPathObjectPtr)0x0) {
    return;
  }
  if ((ctxt == (xmlXPathContextPtr)0x0) || (ctxt->cache == (void *)0x0)) {
    xmlXPathFreeObject(obj);
    return;
  }
  puVar1 = (undefined8 *)ctxt->cache;
  switch(obj->type) {
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    if (obj->nodesetval == (xmlNodeSetPtr)0x0) break;
    if ((0x28 < obj->nodesetval->nodeMax) || (*(int *)((long)puVar1 + 0x14) <= *(int *)(puVar1 + 2))
       ) {
      xmlXPathFreeNodeSet(obj->nodesetval);
      obj->nodesetval = (xmlNodeSetPtr)0x0;
      break;
    }
    obj->stringval = (xmlChar *)*puVar1;
    *puVar1 = obj;
    *(int *)(puVar1 + 2) = *(int *)(puVar1 + 2) + 1;
    goto LAB_0021e50d;
  case XPATH_BOOLEAN:
  case XPATH_NUMBER:
    break;
  case XPATH_STRING:
    if (obj->stringval != (xmlChar *)0x0) {
      (*xmlFree)(obj->stringval);
    }
    obj->stringval = (xmlChar *)0x0;
    break;
  default:
    goto LAB_0021e593;
  }
  if (*(int *)(puVar1 + 3) < *(int *)((long)puVar1 + 0x1c)) {
    obj->stringval = (xmlChar *)puVar1[1];
    puVar1[1] = obj;
    *(int *)(puVar1 + 3) = *(int *)(puVar1 + 3) + 1;
LAB_0021e50d:
    obj->boolval = 0;
    if (obj->nodesetval != (xmlNodeSetPtr)0x0) {
      pxVar2 = obj->nodesetval;
      if (0 < pxVar2->nodeNr) {
        for (node._4_4_ = 0; node._4_4_ < pxVar2->nodeNr; node._4_4_ = node._4_4_ + 1) {
          ns = pxVar2->nodeTab[node._4_4_];
          if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
            xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
          }
        }
      }
      pxVar2->nodeNr = 0;
    }
  }
  else {
LAB_0021e593:
    if (obj->nodesetval != (xmlNodeSetPtr)0x0) {
      xmlXPathFreeNodeSet(obj->nodesetval);
    }
    (*xmlFree)(obj);
  }
  return;
}

Assistant:

static void
xmlXPathReleaseObject(xmlXPathContextPtr ctxt, xmlXPathObjectPtr obj)
{
    if (obj == NULL)
	return;
    if ((ctxt == NULL) || (ctxt->cache == NULL)) {
	 xmlXPathFreeObject(obj);
    } else {
	xmlXPathContextCachePtr cache =
	    (xmlXPathContextCachePtr) ctxt->cache;

	switch (obj->type) {
	    case XPATH_NODESET:
	    case XPATH_XSLT_TREE:
		if (obj->nodesetval != NULL) {
		    if ((obj->nodesetval->nodeMax <= 40) &&
			(cache->numNodeset < cache->maxNodeset)) {
                        obj->stringval = (void *) cache->nodesetObjs;
                        cache->nodesetObjs = obj;
                        cache->numNodeset += 1;
			goto obj_cached;
		    } else {
			xmlXPathFreeNodeSet(obj->nodesetval);
			obj->nodesetval = NULL;
		    }
		}
		break;
	    case XPATH_STRING:
		if (obj->stringval != NULL)
		    xmlFree(obj->stringval);
                obj->stringval = NULL;
		break;
	    case XPATH_BOOLEAN:
	    case XPATH_NUMBER:
		break;
	    default:
		goto free_obj;
	}

	/*
	* Fallback to adding to the misc-objects slot.
	*/
        if (cache->numMisc >= cache->maxMisc)
	    goto free_obj;
        obj->stringval = (void *) cache->miscObjs;
        cache->miscObjs = obj;
        cache->numMisc += 1;

obj_cached:
        obj->boolval = 0;
	if (obj->nodesetval != NULL) {
	    xmlNodeSetPtr tmpset = obj->nodesetval;

	    /*
	    * Due to those nasty ns-nodes, we need to traverse
	    * the list and free the ns-nodes.
	    */
	    if (tmpset->nodeNr > 0) {
		int i;
		xmlNodePtr node;

		for (i = 0; i < tmpset->nodeNr; i++) {
		    node = tmpset->nodeTab[i];
		    if ((node != NULL) &&
			(node->type == XML_NAMESPACE_DECL))
		    {
			xmlXPathNodeSetFreeNs((xmlNsPtr) node);
		    }
		}
	    }
	    tmpset->nodeNr = 0;
        }

	return;

free_obj:
	/*
	* Cache is full; free the object.
	*/
	if (obj->nodesetval != NULL)
	    xmlXPathFreeNodeSet(obj->nodesetval);
	xmlFree(obj);
    }
}